

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O2

CordRep * absl::lts_20250127::cord_internal::CordRepSubstring::Substring
                    (CordRep *rep,size_t pos,size_t n)

{
  ulong uVar1;
  CordRepSubstring *pCVar2;
  CordRep *pCVar3;
  
  if (rep == (CordRep *)0x0) {
    __assert_fail("rep != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x1a3,
                  "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                 );
  }
  if (n == 0) {
    __assert_fail("n != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x1a4,
                  "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                 );
  }
  uVar1 = rep->length;
  if (uVar1 <= pos) {
    __assert_fail("pos < rep->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x1a5,
                  "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                 );
  }
  if (n <= uVar1 - pos) {
    if (uVar1 == n) {
      LOCK();
      (rep->refcount).count_.super___atomic_base<int>._M_i =
           (rep->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
    }
    else {
      pCVar3 = rep;
      if (rep->tag == '\x01') {
        pCVar2 = CordRep::substring(rep);
        pos = pos + pCVar2->start;
        pCVar2 = CordRep::substring(rep);
        pCVar3 = pCVar2->child;
      }
      rep = (CordRep *)operator_new(0x20);
      rep->length = 0;
      rep->refcount = (atomic<int>)0x0;
      rep->tag = '\0';
      rep->storage[0] = '\0';
      rep->storage[1] = '\0';
      rep->storage[2] = '\0';
      (rep->refcount).count_.super___atomic_base<int>._M_i = 2;
      rep->length = n;
      rep->tag = '\x01';
      rep[1].length = pos;
      pCVar3 = CordRep::Ref(pCVar3);
      *(CordRep **)&rep[1].refcount = pCVar3;
    }
    return rep;
  }
  __assert_fail("n <= rep->length - pos",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0x1a6,
                "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
               );
}

Assistant:

inline CordRep* CordRepSubstring::Substring(CordRep* rep, size_t pos,
                                            size_t n) {
  assert(rep != nullptr);
  assert(n != 0);
  assert(pos < rep->length);
  assert(n <= rep->length - pos);
  if (n == rep->length) return CordRep::Ref(rep);
  if (rep->IsSubstring()) {
    pos += rep->substring()->start;
    rep = rep->substring()->child;
  }
  CordRepSubstring* substr = new CordRepSubstring();
  substr->length = n;
  substr->tag = SUBSTRING;
  substr->start = pos;
  substr->child = CordRep::Ref(rep);
  return substr;
}